

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_content(lysp_yin_ctx *ctx,yin_subelement *subelem_info,size_t subelem_info_size,
                        void *parent,ly_stmt parent_stmt,char **text_content,
                        lysp_ext_instance **exts)

{
  uint uVar1;
  lyxml_ctx *plVar2;
  lyd_node *plVar3;
  LY_ERR LVar4;
  ly_stmt kw;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  uint16_t *puVar8;
  uint64_t parent_stmt_index;
  char *format;
  ulong uVar9;
  ly_ctx *plVar10;
  void *pvVar11;
  yin_subelement *pyVar12;
  yin_argument arg_type;
  yang_arg arg_val_type;
  char **text_content_00;
  ly_stmt lVar13;
  LYXML_PARSER_STATUS next_status;
  yang_module_stmt gr;
  lysp_ext_instance **exts_00;
  LYXML_PARSER_STATUS local_80;
  yang_module_stmt local_7c;
  uint16_t *local_78;
  ulong local_70;
  yin_subelement local_68;
  undefined4 local_50;
  void *local_48;
  undefined2 local_40;
  
  plVar2 = ctx->xmlctx;
  if (plVar2->status != LYXML_ELEM_CONTENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CONTENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xd8b,
                  "LY_ERR yin_parse_content(struct lysp_yin_ctx *, struct yin_subelement *, size_t, const void *, enum ly_stmt, const char **, struct lysp_ext_instance **)"
                 );
  }
  if ((plVar2->field_5).ws_only == '\0') {
    local_80 = LYXML_ELEM_CLOSE;
  }
  else {
    LVar4 = lyxml_ctx_peek(plVar2,&local_80);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    if (local_80 == LYXML_ELEMENT) {
      LVar4 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      local_70 = (ulong)((uint)subelem_info_size & 0x7f);
      local_78 = &subelem_info->flags;
      lVar13 = LY_STMT_NONE;
      while (plVar2 = ctx->xmlctx, plVar2->status == LYXML_ELEMENT) {
        kw = yin_match_keyword(ctx,(plVar2->field_5).name,(plVar2->field_6).name_len,
                               (plVar2->field_3).prefix,(plVar2->field_4).prefix_len,parent_stmt);
        sVar5 = subelem_info_size;
        pyVar12 = subelem_info;
        if (subelem_info_size == 0) {
LAB_0018160e:
          if (parent_stmt != LY_STMT_DEVIATE) goto LAB_001817af;
          if ((int)kw < 0x1a0000) {
            if ((int)kw < 0xf0000) {
              if ((kw == LY_STMT_CONFIG) || (kw == LY_STMT_DEFAULT)) goto LAB_00181791;
            }
            else if ((kw == LY_STMT_EXTENSION_INSTANCE) ||
                    ((kw == LY_STMT_MANDATORY || (kw == LY_STMT_MAX_ELEMENTS)))) {
LAB_00181791:
              if (ctx == (lysp_yin_ctx *)0x0) {
                plVar10 = (ly_ctx *)0x0;
              }
              else {
                plVar10 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(kw);
              ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YIN,
                      "Deviate of this type doesn\'t allow \"%s\" as it\'s sub-element.",pcVar7);
              return LY_EVALID;
            }
          }
          else if ((int)kw < 0x2e0000) {
            if ((kw == LY_STMT_MIN_ELEMENTS) || (kw == LY_STMT_MUST)) goto LAB_00181791;
          }
          else if ((kw == LY_STMT_TYPE) || ((kw == LY_STMT_UNITS || (kw == LY_STMT_UNIQUE))))
          goto LAB_00181791;
LAB_001817af:
          if (ctx == (lysp_yin_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          uVar1 = *(uint *)&ctx->xmlctx->field_6;
          pcVar7 = (ctx->xmlctx->field_5).name;
          pcVar6 = lyplg_ext_stmt2str(parent_stmt);
          ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YIN,
                  "Unexpected sub-element \"%.*s\" of \"%s\" element.",(ulong)uVar1,pcVar7,pcVar6);
          return LY_EVALID;
        }
        while (pyVar12->type != kw) {
          pyVar12 = pyVar12 + 1;
          sVar5 = sVar5 - 1;
          if (sVar5 == 0) goto LAB_0018160e;
        }
        if ((parent_stmt == LY_STMT_SUBMODULE) || (parent_stmt == LY_STMT_MODULE)) {
          if ((parent_stmt != LY_STMT_MODULE) && (parent_stmt != LY_STMT_SUBMODULE)) {
            __assert_fail("parent_stmt == LY_STMT_MODULE || parent_stmt == LY_STMT_SUBMODULE",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                          ,0xbe7,
                          "LY_ERR yin_check_relative_order(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, enum ly_stmt)"
                         );
          }
          if (lVar13 != LY_STMT_EXTENSION_INSTANCE) {
            LVar4 = kw2kw_group(ctx,lVar13,&local_68.type);
            if (LVar4 != LY_SUCCESS) {
              return LVar4;
            }
            LVar4 = kw2kw_group(ctx,kw,&local_7c);
            if (LVar4 != LY_SUCCESS) {
              return LVar4;
            }
            if (local_7c < local_68.type) {
              if (ctx == (lysp_yin_ctx *)0x0) {
                plVar10 = (ly_ctx *)0x0;
              }
              else {
                plVar10 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(parent_stmt);
              pcVar6 = lyplg_ext_stmt2str(kw);
              lyplg_ext_stmt2str(lVar13);
              format = "Invalid order of %s\'s sub-elements \"%s\" can\'t appear after \"%s\".";
              goto LAB_0018185c;
            }
          }
        }
        uVar1 = *(uint *)&pyVar12->flags;
        if ((~uVar1 & 0x82) == 0) {
          if (ctx == (lysp_yin_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar7 = lyplg_ext_stmt2str(kw);
          pcVar6 = lyplg_ext_stmt2str(parent_stmt);
          format = "Redefinition of \"%s\" sub-element in \"%s\" element.";
          goto LAB_0018185c;
        }
        if (('\0' < (char)subelem_info_size) &&
           (puVar8 = local_78, uVar9 = local_70, (uVar1 & 4) != 0)) {
          do {
            if ((*puVar8 & 0x80) != 0) {
              if (ctx == (lysp_yin_ctx *)0x0) {
                plVar10 = (ly_ctx *)0x0;
              }
              else {
                plVar10 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(pyVar12->type);
              pcVar6 = lyplg_ext_stmt2str(parent_stmt);
              format = 
              "Sub-element \"%s\" of \"%s\" element must be defined as it\'s first sub-element.";
              goto LAB_0018185c;
            }
            puVar8 = puVar8 + 0xc;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        if (((uVar1 & 8) != 0) &&
           (plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
           *(byte *)&plVar3[2].schema < 2)) {
          plVar10 = (ly_ctx *)**(undefined8 **)plVar3;
          pcVar7 = lyplg_ext_stmt2str(kw);
          pcVar6 = lyplg_ext_stmt2str(parent_stmt);
          format = 
          "Invalid sub-elemnt \"%s\" of \"%s\" element - this sub-element is allowed only in modules with version 1.1 or newer."
          ;
          goto LAB_0018185c;
        }
        pyVar12->flags = (ushort)uVar1 | 0x80;
        pvVar11 = parent;
        lVar13 = kw;
        if ((int)kw < 0x130000) {
          if ((int)kw < 0x20000) {
            if ((int)kw < 0x200) {
              if ((int)kw < 0x20) {
                switch(kw) {
                case LY_STMT_NOTIFICATION:
                  LVar4 = yin_parse_notification(ctx,(tree_node_meta *)pyVar12->dest);
                  break;
                case LY_STMT_INPUT:
                case LY_STMT_OUTPUT:
                  LVar4 = yin_parse_inout(ctx,kw,(inout_meta *)pyVar12->dest);
                  break;
                case LY_STMT_INPUT|LY_STMT_NOTIFICATION:
                case LY_STMT_OUTPUT|LY_STMT_NOTIFICATION:
                case LY_STMT_OUTPUT|LY_STMT_INPUT:
                case LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION:
switchD_00180b92_caseD_3:
                  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                         ,0xe90);
                  return LY_EINT;
                default:
                  if (kw != LY_STMT_RPC) goto switchD_00180b92_caseD_3;
                case LY_STMT_ACTION:
                  LVar4 = yin_parse_action(ctx,(tree_node_meta *)pyVar12->dest);
                }
              }
              else if ((int)kw < 0x80) {
                if ((kw != LY_STMT_ANYDATA) && (kw != LY_STMT_ANYXML))
                goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_any(ctx,kw,(tree_node_meta *)pyVar12->dest);
              }
              else if (kw == LY_STMT_AUGMENT) {
                LVar4 = yin_parse_augment(ctx,(tree_node_meta *)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_CASE) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_case(ctx,(tree_node_meta *)pyVar12->dest);
              }
            }
            else if ((int)kw < 0x2000) {
              if ((int)kw < 0x800) {
                if (kw == LY_STMT_CHOICE) {
                  LVar4 = yin_parse_choice(ctx,(tree_node_meta *)pyVar12->dest);
                }
                else {
                  if (kw != LY_STMT_CONTAINER) goto switchD_00180b92_caseD_3;
                  LVar4 = yin_parse_container(ctx,(tree_node_meta *)pyVar12->dest);
                }
              }
              else if (kw == LY_STMT_GROUPING) {
                LVar4 = yin_parse_grouping(ctx,(tree_node_meta *)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_LEAF) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_leaf(ctx,(tree_node_meta *)pyVar12->dest);
              }
            }
            else if ((int)kw < 0x8000) {
              if (kw == LY_STMT_LEAF_LIST) {
                LVar4 = yin_parse_leaflist(ctx,(tree_node_meta *)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_LIST) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_list(ctx,(tree_node_meta *)pyVar12->dest);
              }
            }
            else if (kw == LY_STMT_USES) {
              LVar4 = yin_parse_uses(ctx,(tree_node_meta *)pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_ARGUMENT) goto switchD_00180b92_caseD_3;
              LVar4 = yin_parse_argument(ctx,parent,(yin_argument_meta *)pyVar12->dest,exts);
            }
          }
          else if ((int)kw < 0xa0000) {
            if ((int)kw < 0x60000) {
              if ((int)kw < 0x40000) {
                if (kw == LY_STMT_BASE) {
                  LVar4 = yin_parse_base(ctx,parent_stmt,pyVar12->dest,exts);
                }
                else {
                  if (kw != LY_STMT_BELONGS_TO) goto switchD_00180b92_caseD_3;
                  LVar4 = yin_parse_belongs_to(ctx,(lysp_submodule *)pyVar12->dest,exts);
                }
              }
              else if (kw == LY_STMT_BIT) {
                LVar4 = yin_parse_bit(ctx,(lysp_type *)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_CONFIG) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_config(ctx,(uint16_t *)pyVar12->dest,exts);
              }
            }
            else {
              if ((int)kw < 0x80000) {
                if (kw != LY_STMT_CONTACT) {
                  if (kw != LY_STMT_DEFAULT) goto switchD_00180b92_caseD_3;
                  lVar13 = LY_STMT_DEFAULT;
                  goto LAB_00181254;
                }
              }
              else if (kw != LY_STMT_DESCRIPTION) {
                if (kw != LY_STMT_DEVIATE) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_deviate(ctx,(lysp_deviate **)pyVar12->dest);
                goto LAB_0018158c;
              }
LAB_0018111a:
              local_48 = pyVar12->dest;
              local_68.dest = (void *)0x0;
              local_68.flags = 0;
              local_68._18_6_ = 0;
              local_68.type = LY_STMT_EXTENSION_INSTANCE;
              local_68._4_4_ = 0;
              local_50 = 0x350004;
              local_40 = 7;
              if ((int)kw < 0x200000) {
                if ((kw != LY_STMT_CONTACT) && (kw != LY_STMT_DESCRIPTION)) {
LAB_001819a7:
                  __assert_fail("parent_stmt == LY_STMT_ORGANIZATION || parent_stmt == LY_STMT_CONTACT || parent_stmt == LY_STMT_DESCRIPTION || parent_stmt == LY_STMT_REFERENCE"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                                ,0x4e8,
                                "LY_ERR yin_parse_meta(struct lysp_yin_ctx *, const void *, enum ly_stmt, const char **, struct lysp_ext_instance **)"
                               );
                }
              }
              else if ((kw != LY_STMT_ORGANIZATION) && (kw != LY_STMT_REFERENCE)) goto LAB_001819a7;
              LVar4 = lyxml_ctx_next(ctx->xmlctx);
              if ((LVar4 == LY_SUCCESS) &&
                 (LVar4 = yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,kw),
                 LVar4 == LY_SUCCESS)) {
                sVar5 = 2;
                pyVar12 = &local_68;
                text_content_00 = (char **)0x0;
                exts_00 = exts;
LAB_0018156a:
                LVar4 = yin_parse_content(ctx,pyVar12,sVar5,parent,kw,text_content_00,exts_00);
              }
            }
          }
          else if ((int)kw < 0xe0000) {
            if ((int)kw < 0xc0000) {
              if (kw == LY_STMT_DEVIATION) {
                LVar4 = yin_parse_deviation(ctx,(lysp_deviation **)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_ENUM) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_enum(ctx,(lysp_type *)pyVar12->dest);
              }
            }
            else {
              if (kw == LY_STMT_ERROR_APP_TAG) goto LAB_00181307;
              if (kw != LY_STMT_ERROR_MESSAGE) goto switchD_00180b92_caseD_3;
              LVar4 = yin_parse_err_msg(ctx,parent,(char **)pyVar12->dest,exts);
            }
          }
          else if ((int)kw < 0x100000) {
            if (kw == LY_STMT_EXTENSION) {
              LVar4 = yin_parse_extension(ctx,(lysp_ext **)pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_EXTENSION_INSTANCE) goto switchD_00180b92_caseD_3;
              if ((uint64_t *)pyVar12->dest == (uint64_t *)0x0) {
                parent_stmt_index = 0;
              }
              else {
                parent_stmt_index = *pyVar12->dest;
              }
              LVar4 = yin_parse_extension_instance(ctx,parent,parent_stmt,parent_stmt_index,exts);
            }
          }
          else if (kw == LY_STMT_FEATURE) {
            LVar4 = yin_parse_feature(ctx,(lysp_feature **)pyVar12->dest);
          }
          else if (kw == LY_STMT_FRACTION_DIGITS) {
            LVar4 = yin_parse_fracdigits(ctx,(lysp_type *)pyVar12->dest);
          }
          else {
            if (kw != LY_STMT_IDENTITY) goto switchD_00180b92_caseD_3;
            LVar4 = yin_parse_identity(ctx,(lysp_ident **)pyVar12->dest);
          }
        }
        else if ((int)kw < 0x260000) {
          if ((int)kw < 0x1d0000) {
            if ((int)kw < 0x170000) {
              if ((int)kw < 0x150000) {
                if (kw == LY_STMT_IF_FEATURE) goto LAB_00181254;
                if (kw != LY_STMT_IMPORT) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_import(ctx,(import_meta *)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_INCLUDE) {
                  if (kw != LY_STMT_KEY) goto switchD_00180b92_caseD_3;
LAB_00181307:
                  arg_type = YIN_ARG_VALUE;
                  goto LAB_00181310;
                }
                if ((parent_stmt == LY_STMT_SUBMODULE) &&
                   (plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                   *(char *)&plVar3[2].schema == '\x02')) {
                  ly_log((ly_ctx *)**(undefined8 **)plVar3,LY_LLWRN,LY_SUCCESS,
                         "YANG version 1.1 expects all includes in main module, includes in submodules (%s) are not necessary."
                         ,plVar3[2].parent);
                }
                LVar4 = yin_parse_include(ctx,(include_meta *)pyVar12->dest);
              }
            }
            else if ((int)kw < 0x190000) {
              if (kw == LY_STMT_LENGTH) {
                LVar4 = yin_parse_length(ctx,(lysp_type *)pyVar12->dest);
              }
              else {
                if (kw != LY_STMT_MANDATORY) goto switchD_00180b92_caseD_3;
                LVar4 = yin_parse_mandatory(ctx,(uint16_t *)pyVar12->dest,exts);
              }
            }
            else if ((kw == LY_STMT_MAX_ELEMENTS) || (kw == LY_STMT_MIN_ELEMENTS)) {
              LVar4 = yin_parse_minmax(ctx,parent_stmt,kw,pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_MODIFIER) goto switchD_00180b92_caseD_3;
              LVar4 = yin_parse_modifier(ctx,parent,(char **)pyVar12->dest,exts);
            }
          }
          else if ((int)kw < 0x210000) {
            if ((int)kw < 0x1f0000) {
              if (kw != LY_STMT_MUST) {
                if (kw != LY_STMT_NAMESPACE) goto switchD_00180b92_caseD_3;
                lVar13 = LY_STMT_NAMESPACE;
                arg_type = YIN_ARG_URI;
                goto LAB_00181310;
              }
              LVar4 = yin_parse_must(ctx,(lysp_restr **)pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_ORDERED_BY) {
                if (kw != LY_STMT_ORGANIZATION) goto switchD_00180b92_caseD_3;
                goto LAB_0018111a;
              }
              LVar4 = yin_parse_orderedby(ctx,parent,(uint16_t *)pyVar12->dest,exts);
            }
          }
          else if ((int)kw < 0x230000) {
            if (kw == LY_STMT_PATH) {
              LVar4 = yin_parse_path(ctx,(lysp_type *)pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_PATTERN) goto switchD_00180b92_caseD_3;
              LVar4 = yin_parse_pattern(ctx,(lysp_type *)pyVar12->dest);
            }
          }
          else {
            if (kw == LY_STMT_POSITION) goto LAB_0018123c;
            if (kw != LY_STMT_PREFIX) {
              if (kw != LY_STMT_PRESENCE) goto switchD_00180b92_caseD_3;
              pvVar11 = *pyVar12->dest;
              lVar13 = LY_STMT_PRESENCE;
              goto LAB_00181307;
            }
            pvVar11 = *pyVar12->dest;
            lVar13 = LY_STMT_PREFIX;
            arg_type = YIN_ARG_VALUE;
            arg_val_type = Y_IDENTIF_ARG;
LAB_00181316:
            LVar4 = yin_parse_simple_elem(ctx,pvVar11,lVar13,pyVar12,arg_type,arg_val_type,exts);
          }
        }
        else if ((int)kw < 0x300000) {
          if ((int)kw < 0x2a0000) {
            if ((int)kw < 0x280000) {
              if (kw != LY_STMT_RANGE) {
                if (kw != LY_STMT_REFERENCE) goto switchD_00180b92_caseD_3;
                goto LAB_0018111a;
              }
              LVar4 = yin_parse_range(ctx,(lysp_type *)pyVar12->dest);
            }
            else if (kw == LY_STMT_REFINE) {
              LVar4 = yin_parse_refine(ctx,(lysp_refine **)pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_REQUIRE_INSTANCE) goto switchD_00180b92_caseD_3;
              LVar4 = yin_pasrse_reqinstance(ctx,(lysp_type *)pyVar12->dest);
            }
          }
          else if ((int)kw < 0x2c0000) {
            if (kw == LY_STMT_REVISION) {
              LVar4 = yin_parse_revision(ctx,(lysp_revision **)pyVar12->dest);
            }
            else {
              if (kw != LY_STMT_REVISION_DATE) goto switchD_00180b92_caseD_3;
              LVar4 = yin_parse_revision_date(ctx,(char *)pyVar12->dest,exts);
            }
          }
          else if (kw == LY_STMT_STATUS) {
            LVar4 = yin_parse_status(ctx,(uint16_t *)pyVar12->dest,exts);
          }
          else if (kw == LY_STMT_TYPE) {
            LVar4 = yin_parse_type(ctx,parent_stmt,pyVar12);
          }
          else {
            if (kw != LY_STMT_TYPEDEF) goto switchD_00180b92_caseD_3;
            LVar4 = yin_parse_typedef(ctx,(tree_node_meta *)pyVar12->dest);
          }
        }
        else if ((int)kw < 0x340000) {
          if ((int)kw < 0x320000) {
            if (kw != LY_STMT_UNIQUE) {
              if (kw != LY_STMT_UNITS) goto switchD_00180b92_caseD_3;
              pvVar11 = *pyVar12->dest;
              lVar13 = LY_STMT_UNITS;
              arg_type = YIN_ARG_NAME;
LAB_00181310:
              arg_val_type = Y_STR_ARG;
              goto LAB_00181316;
            }
LAB_00181254:
            LVar4 = yin_parse_qname(ctx,lVar13,pyVar12,exts);
          }
          else if (kw == LY_STMT_VALUE) {
LAB_0018123c:
            LVar4 = yin_parse_value_pos(ctx,kw,(lysp_type_enum *)pyVar12->dest);
          }
          else {
            if (kw != LY_STMT_WHEN) goto switchD_00180b92_caseD_3;
            LVar4 = yin_parse_when(ctx,(lysp_when **)pyVar12->dest);
          }
        }
        else {
          if (kw - LY_STMT_ARG_TEXT < 2) {
            LVar4 = lyxml_ctx_next(ctx->xmlctx);
            while( true ) {
              if (LVar4 != LY_SUCCESS) {
                return LVar4;
              }
              if (ctx->xmlctx->status != LYXML_ATTRIBUTE) break;
              LVar4 = lyxml_ctx_next(ctx->xmlctx);
              if (LVar4 != LY_SUCCESS) {
                return LVar4;
              }
              LVar4 = lyxml_ctx_next(ctx->xmlctx);
            }
            text_content_00 = (char **)pyVar12->dest;
            exts_00 = (lysp_ext_instance **)0x0;
            pyVar12 = (yin_subelement *)0x0;
            sVar5 = 0;
            goto LAB_0018156a;
          }
          if (kw == LY_STMT_YANG_VERSION) {
            LVar4 = yin_parse_yangversion(ctx,parent,(uint8_t *)pyVar12->dest,exts);
          }
          else {
            if (kw != LY_STMT_YIN_ELEMENT) goto switchD_00180b92_caseD_3;
            LVar4 = yin_parse_yin_element(ctx,parent,(uint16_t *)pyVar12->dest,exts);
          }
        }
LAB_0018158c:
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        LVar4 = lyxml_ctx_next(ctx->xmlctx);
        lVar13 = kw;
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
      }
      goto LAB_00181693;
    }
  }
  LVar4 = yin_validate_value(ctx,Y_STR_ARG);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (text_content != (char **)0x0) {
    plVar2 = ctx->xmlctx;
    if ((plVar2->field_6).dynamic == '\0') {
      if ((plVar2->field_4).prefix_len == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (plVar2->field_3).prefix;
      }
      LVar4 = lydict_insert(plVar2->ctx,pcVar7,(plVar2->field_4).prefix_len,text_content);
    }
    else {
      LVar4 = lydict_insert_zc(plVar2->ctx,(plVar2->field_3).prefix,text_content);
    }
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    (ctx->xmlctx->field_6).dynamic = '\0';
    if (*text_content == (char *)0x0) {
      return LY_EMEM;
    }
  }
  LVar4 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
LAB_00181693:
  if ('\0' < (char)subelem_info_size) {
    uVar9 = (ulong)((uint)subelem_info_size & 0x7f);
    puVar8 = &subelem_info->flags;
    do {
      if ((*puVar8 & 0x81) == 1) {
        if (ctx == (lysp_yin_ctx *)0x0) {
          plVar10 = (ly_ctx *)0x0;
        }
        else {
          plVar10 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
        }
        pcVar7 = lyplg_ext_stmt2str(((yin_subelement *)(puVar8 + -8))->type);
        pcVar6 = lyplg_ext_stmt2str(parent_stmt);
        format = "Missing mandatory sub-element \"%s\" of \"%s\" element.";
LAB_0018185c:
        ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YIN,format,pcVar7,pcVar6);
        return LY_EVALID;
      }
      puVar8 = puVar8 + 0xc;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
yin_parse_content(struct lysp_yin_ctx *ctx, struct yin_subelement *subelem_info, size_t subelem_info_size,
        const void *parent, enum ly_stmt parent_stmt, const char **text_content, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    enum LYXML_PARSER_STATUS next_status;
    enum ly_stmt cur_stmt = LY_STMT_NONE, last_stmt = LY_STMT_NONE;
    struct yin_subelement *subelem = NULL;

    assert(ctx->xmlctx->status == LYXML_ELEM_CONTENT);

    if (ctx->xmlctx->ws_only) {
        /* check whether there are any children */
        LY_CHECK_GOTO(ret = lyxml_ctx_peek(ctx->xmlctx, &next_status), cleanup);
    } else {
        /* we want to parse the value */
        next_status = LYXML_ELEM_CLOSE;
    }

    if (next_status == LYXML_ELEMENT) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* current element has subelements as content */
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* match keyword */
            last_stmt = cur_stmt;
            cur_stmt = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
                    ctx->xmlctx->prefix_len, parent_stmt);

            /* check if this element can be child of current element */
            subelem = get_record(cur_stmt, subelem_info_size, subelem_info);
            if (!subelem) {
                if ((parent_stmt == LY_STMT_DEVIATE) && isdevsub(cur_stmt)) {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INDEV_YIN, lyplg_ext_stmt2str(cur_stmt));
                } else {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len,
                            ctx->xmlctx->name, lyplg_ext_stmt2str(parent_stmt));
                }
                ret = LY_EVALID;
                goto cleanup;
            }

            /* relative order is required only in module and submodule sub-elements */
            if ((parent_stmt == LY_STMT_MODULE) || (parent_stmt == LY_STMT_SUBMODULE)) {
                ret = yin_check_relative_order(ctx, last_stmt, cur_stmt, parent_stmt);
                LY_CHECK_GOTO(ret, cleanup);
            }

            /* flag check */
            if ((subelem->flags & YIN_SUBELEM_UNIQUE) && (subelem->flags & YIN_SUBELEM_PARSED)) {
                /* subelement uniquenes */
                LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_SUBELEM_REDEF, lyplg_ext_stmt2str(cur_stmt), lyplg_ext_stmt2str(parent_stmt));
                return LY_EVALID;
            }
            if (subelem->flags & YIN_SUBELEM_FIRST) {
                /* subelement is supposed to be defined as first subelement */
                ret = yin_check_subelem_first_constraint(ctx, subelem_info, subelem_info_size, parent_stmt, subelem);
                LY_CHECK_GOTO(ret, cleanup);
            }
            if (subelem->flags & YIN_SUBELEM_VER2) {
                /* subelement is supported only in version 1.1 or higher */
                if (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1) {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INSUBELEM2, lyplg_ext_stmt2str(cur_stmt), lyplg_ext_stmt2str(parent_stmt));
                    ret = LY_EVALID;
                    goto cleanup;
                }
            }
            /* note that element was parsed for easy uniqueness check in next iterations */
            subelem->flags |= YIN_SUBELEM_PARSED;

            switch (cur_stmt) {
            /* call responsible function */
            case LY_STMT_EXTENSION_INSTANCE:
                ret = yin_parse_extension_instance(ctx, parent, parent_stmt,
                        (subelem->dest) ? *((LY_ARRAY_COUNT_TYPE *)subelem->dest) : 0, exts);
                break;
            case LY_STMT_ACTION:
            case LY_STMT_RPC:
                ret = yin_parse_action(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ANYDATA:
            case LY_STMT_ANYXML:
                ret = yin_parse_any(ctx, cur_stmt, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ARGUMENT:
                ret = yin_parse_argument(ctx, parent, (struct yin_argument_meta *)subelem->dest, exts);
                break;
            case LY_STMT_AUGMENT:
                ret = yin_parse_augment(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_BASE:
                ret = yin_parse_base(ctx, parent_stmt, subelem->dest, exts);
                break;
            case LY_STMT_BELONGS_TO:
                ret = yin_parse_belongs_to(ctx, (struct lysp_submodule *)subelem->dest, exts);
                break;
            case LY_STMT_BIT:
                ret = yin_parse_bit(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_CASE:
                ret = yin_parse_case(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_CHOICE:
                ret = yin_parse_choice(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_CONFIG:
                ret = yin_parse_config(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_CONTACT:
            case LY_STMT_DESCRIPTION:
            case LY_STMT_ORGANIZATION:
            case LY_STMT_REFERENCE:
                ret = yin_parse_meta(ctx, parent, cur_stmt, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_CONTAINER:
                ret = yin_parse_container(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_DEFAULT:
                ret = yin_parse_qname(ctx, cur_stmt, subelem, exts);
                break;
            case LY_STMT_ERROR_APP_TAG:
            case LY_STMT_KEY:
                ret = yin_parse_simple_elem(ctx, parent, cur_stmt, subelem, YIN_ARG_VALUE, Y_STR_ARG, exts);
                break;
            case LY_STMT_PRESENCE:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_VALUE, Y_STR_ARG, exts);
                break;
            case LY_STMT_DEVIATE:
                ret = yin_parse_deviate(ctx, (struct lysp_deviate **)subelem->dest);
                break;
            case LY_STMT_DEVIATION:
                ret = yin_parse_deviation(ctx, (struct lysp_deviation **)subelem->dest);
                break;
            case LY_STMT_ENUM:
                ret = yin_parse_enum(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_ERROR_MESSAGE:
                ret = yin_parse_err_msg(ctx, parent, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_EXTENSION:
                ret = yin_parse_extension(ctx, (struct lysp_ext **)subelem->dest);
                break;
            case LY_STMT_FEATURE:
                ret = yin_parse_feature(ctx, (struct lysp_feature **)subelem->dest);
                break;
            case LY_STMT_FRACTION_DIGITS:
                ret = yin_parse_fracdigits(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_GROUPING:
                ret = yin_parse_grouping(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_IDENTITY:
                ret = yin_parse_identity(ctx, (struct lysp_ident **)subelem->dest);
                break;
            case LY_STMT_UNIQUE:
            case LY_STMT_IF_FEATURE:
                ret = yin_parse_qname(ctx, cur_stmt, subelem, exts);
                break;
            case LY_STMT_UNITS:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_NAME, Y_STR_ARG, exts);
                break;
            case LY_STMT_IMPORT:
                ret = yin_parse_import(ctx, (struct import_meta *)subelem->dest);
                break;
            case LY_STMT_INCLUDE:
                if ((parent_stmt == LY_STMT_SUBMODULE) && (PARSER_CUR_PMOD(ctx)->version == LYS_VERSION_1_1)) {
                    LOGWRN(PARSER_CTX(ctx), "YANG version 1.1 expects all includes in main module, includes in "
                            "submodules (%s) are not necessary.", ((struct lysp_submodule *)PARSER_CUR_PMOD(ctx))->name);
                }
                ret = yin_parse_include(ctx, (struct include_meta *)subelem->dest);
                break;
            case LY_STMT_INPUT:
            case LY_STMT_OUTPUT:
                ret = yin_parse_inout(ctx, cur_stmt, (struct inout_meta *)subelem->dest);
                break;
            case LY_STMT_LEAF:
                ret = yin_parse_leaf(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_LEAF_LIST:
                ret = yin_parse_leaflist(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_LENGTH:
                ret = yin_parse_length(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_LIST:
                ret = yin_parse_list(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_MANDATORY:
                ret = yin_parse_mandatory(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_MAX_ELEMENTS:
            case LY_STMT_MIN_ELEMENTS:
                ret = yin_parse_minmax(ctx, parent_stmt, cur_stmt, subelem->dest);
                break;
            case LY_STMT_MODIFIER:
                ret = yin_parse_modifier(ctx, parent, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_MUST:
                ret = yin_parse_must(ctx, (struct lysp_restr **)subelem->dest);
                break;
            case LY_STMT_NAMESPACE:
                ret = yin_parse_simple_elem(ctx, parent, cur_stmt, subelem, YIN_ARG_URI, Y_STR_ARG, exts);
                break;
            case LY_STMT_NOTIFICATION:
                ret = yin_parse_notification(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ORDERED_BY:
                ret = yin_parse_orderedby(ctx, parent, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_PATH:
                ret = yin_parse_path(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_PATTERN:
                ret = yin_parse_pattern(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_VALUE:
            case LY_STMT_POSITION:
                ret = yin_parse_value_pos(ctx, cur_stmt, (struct lysp_type_enum *)subelem->dest);
                break;
            case LY_STMT_PREFIX:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_VALUE,
                        Y_IDENTIF_ARG, exts);
                break;
            case LY_STMT_RANGE:
                ret = yin_parse_range(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_REFINE:
                ret = yin_parse_refine(ctx, (struct lysp_refine **)subelem->dest);
                break;
            case LY_STMT_REQUIRE_INSTANCE:
                ret = yin_pasrse_reqinstance(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_REVISION:
                ret = yin_parse_revision(ctx, (struct lysp_revision **)subelem->dest);
                break;
            case LY_STMT_REVISION_DATE:
                ret = yin_parse_revision_date(ctx, (char *)subelem->dest, exts);
                break;
            case LY_STMT_STATUS:
                ret = yin_parse_status(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_TYPE:
                ret = yin_parse_type(ctx, parent_stmt, subelem);
                break;
            case LY_STMT_TYPEDEF:
                ret = yin_parse_typedef(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_USES:
                ret = yin_parse_uses(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_WHEN:
                ret = yin_parse_when(ctx, (struct lysp_when **)subelem->dest);
                break;
            case LY_STMT_YANG_VERSION:
                ret = yin_parse_yangversion(ctx, parent, (uint8_t *)subelem->dest, exts);
                break;
            case LY_STMT_YIN_ELEMENT:
                ret = yin_parse_yin_element(ctx, parent, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_ARG_TEXT:
            case LY_STMT_ARG_VALUE:
                /* TODO what to do with content/attributes? */
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
                    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                }
                ret = yin_parse_content(ctx, NULL, 0, parent, cur_stmt, (const char **)subelem->dest, NULL);
                break;
            default:
                LOGINT(ctx->xmlctx->ctx);
                ret = LY_EINT;
            }
            LY_CHECK_GOTO(ret, cleanup);

            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        LY_CHECK_RET(ret);
        /* elements with text or none content */
        /* save text content, if text_content isn't set, it's just ignored */
        /* no resources are allocated in this branch, no need to use cleanup label */
        LY_CHECK_RET(yin_validate_value(ctx, Y_STR_ARG));
        if (text_content) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, *text_content);
            LY_CHECK_RET(!*text_content, LY_EMEM);
        }

        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

    /* mandatory subelements are checked only after whole element was succesfully parsed */
    LY_CHECK_RET(yin_check_subelem_mandatory_constraint(ctx, subelem_info, subelem_info_size, parent_stmt));

cleanup:
    return ret;
}